

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t zip_read_data_zipx_xz(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  zip *zip;
  uint64_t uVar1;
  size_t sVar2;
  lzma_ret lVar3;
  wchar_t wVar4;
  uint8_t *puVar5;
  uchar *puVar6;
  ulong uVar7;
  char *pcVar8;
  int error_number;
  ssize_t bytes_avail;
  size_t local_30;
  
  zip = (zip *)a->format->data;
  if (zip->decompress_init == '\0') {
    if (zip->zipx_lzma_valid != '\0') {
      lzma_end(&zip->zipx_lzma_stream);
      zip->zipx_lzma_valid = '\0';
    }
    memset(&zip->zipx_lzma_stream,0,0x88);
    lVar3 = lzma_stream_decoder(&zip->zipx_lzma_stream,0xffffffffffffffff,0);
    if (lVar3 != LZMA_OK) {
      archive_set_error(&a->archive,-1,"xz initialization failed(%d)",(ulong)lVar3);
      return L'\xffffffe7';
    }
    zip->zipx_lzma_valid = '\x01';
    free(zip->uncompressed_buffer);
    zip->uncompressed_buffer_size = 0x40000;
    puVar6 = (uchar *)malloc(0x40000);
    zip->uncompressed_buffer = puVar6;
    if (puVar6 != (uchar *)0x0) {
      zip->decompress_init = '\x01';
      goto LAB_0015ecd0;
    }
    pcVar8 = "No memory for xz decompression";
    error_number = 0xc;
LAB_0015ee43:
    archive_set_error(&a->archive,error_number,pcVar8);
    goto LAB_0015eebc;
  }
LAB_0015ecd0:
  puVar5 = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_30);
  if ((long)local_30 < 0) {
    pcVar8 = "Truncated xz file body";
    error_number = 0x54;
    goto LAB_0015ee43;
  }
  if (zip->entry_bytes_remaining < (long)local_30) {
    local_30 = zip->entry_bytes_remaining;
  }
  (zip->zipx_lzma_stream).next_in = puVar5;
  (zip->zipx_lzma_stream).avail_in = local_30;
  (zip->zipx_lzma_stream).total_in = 0;
  sVar2 = zip->uncompressed_buffer_size;
  (zip->zipx_lzma_stream).next_out = zip->uncompressed_buffer;
  (zip->zipx_lzma_stream).avail_out = sVar2;
  (zip->zipx_lzma_stream).total_out = 0;
  lVar3 = lzma_code(&zip->zipx_lzma_stream,LZMA_RUN);
  switch(lVar3) {
  case LZMA_STREAM_END:
    lzma_end(&zip->zipx_lzma_stream);
    zip->zipx_lzma_valid = '\0';
    if ((zip->zipx_lzma_stream).total_in != zip->entry_bytes_remaining) {
      pcVar8 = "xz premature end of stream";
      error_number = -1;
      goto LAB_0015ee43;
    }
    zip->end_of_entry = '\x01';
  case LZMA_OK:
  case LZMA_NO_CHECK:
    uVar1 = (zip->zipx_lzma_stream).total_in;
    __archive_read_consume(a,uVar1);
    zip->entry_bytes_remaining = zip->entry_bytes_remaining - uVar1;
    zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + uVar1;
    uVar1 = (zip->zipx_lzma_stream).total_out;
    zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar1;
    *size = uVar1;
    *buff = zip->uncompressed_buffer;
    wVar4 = consume_optional_marker(a,zip);
    break;
  default:
    pcVar8 = "xz unknown error %d";
    uVar7 = (ulong)lVar3;
    goto LAB_0015eeb5;
  case LZMA_DATA_ERROR:
    pcVar8 = "xz data error (error %d)";
    uVar7 = 9;
LAB_0015eeb5:
    archive_set_error(&a->archive,-1,pcVar8,uVar7);
LAB_0015eebc:
    wVar4 = L'\xffffffe2';
  }
  return wVar4;
}

Assistant:

static int
zip_read_data_zipx_xz(struct archive_read *a, const void **buff,
	size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume = 0;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_xz_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated xz file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out = zip->uncompressed_buffer_size;
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_NO_CHECK:
		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "xz unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);

		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;

			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xz premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;
	}

	to_consume = zip->zipx_lzma_stream.total_in;

	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	*size = zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}